

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O2

void __thiscall diy::Master::Command<Block>::execute(Command<Block> *this,void *b,ProxyWithLink *cp)

{
  std::function<void_(Block_*,_const_diy::Master::ProxyWithLink_&)>::operator()
            (&this->f,(Block *)b,cp);
  return;
}

Assistant:

void  execute(void* b, const ProxyWithLink& cp) const override                { f(static_cast<Block*>(b), cp); }